

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::JoinCondition::CreateExpression
          (JoinCondition *this,vector<duckdb::JoinCondition,_true> *conditions)

{
  pointer pJVar1;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var2;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var3;
  pointer pJVar4;
  ExpressionType local_59;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_58;
  undefined1 local_50 [16];
  Expression *local_40;
  ExpressionType local_38;
  
  (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  pJVar1 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pJVar4 = (conditions->
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_start; pJVar4 != pJVar1; pJVar4 = pJVar4 + 1) {
    local_50._8_8_ =
         (pJVar4->left).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>;
    (pJVar4->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false> =
         (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
    local_40 = (pJVar4->right).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pJVar4->right).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    local_38 = pJVar4->comparison;
    CreateExpression((JoinCondition *)local_50,(JoinCondition *)(local_50 + 8));
    ~JoinCondition((JoinCondition *)(local_50 + 8));
    if ((Expression *)
        (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> == (Expression *)0x0) {
      (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)local_50._0_8_;
    }
    else {
      local_59 = CONJUNCTION_AND;
      make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&local_58,&local_59,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_50,&this->left);
      _Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           local_58.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      local_58.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)(Expression *)0x0;
      _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (this->left).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>;
      (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           _Var3.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      if (_Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0
         ) {
        (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                    + 8))();
        if (local_58.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (Expression *)0x0) {
          (*((BaseExpression *)
            local_58.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
            _vptr_BaseExpression[1])();
        }
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_50._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_50._0_8_ + 8))();
      }
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> JoinCondition::CreateExpression(vector<JoinCondition> conditions) {
	unique_ptr<Expression> result;
	for (auto &cond : conditions) {
		auto expr = CreateExpression(std::move(cond));
		if (!result) {
			result = std::move(expr);
		} else {
			auto conj = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(expr),
			                                                  std::move(result));
			result = std::move(conj);
		}
	}
	return result;
}